

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall LogMessage::LogMessage(LogMessage *this,char *file,int line,int severity)

{
  ostream *poVar1;
  int severity_local;
  int line_local;
  char *file_local;
  LogMessage *this_local;
  
  this->severity_ = severity;
  this->flushed_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str_);
  poVar1 = stream(this);
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

LogMessage(const char* file, int line, int severity)
      : severity_(severity), flushed_(false) {
    stream() << file << ":" << line << ": ";
  }